

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

ggml_tensor * ggml_sub_impl(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,_Bool inplace)

{
  bool bVar1;
  ggml_tensor *pgVar2;
  ggml_tensor *pgVar3;
  ggml_tensor *b_00;
  
  if ((((a->ne[0] == b->ne[0]) && (a->ne[1] == b->ne[1])) && (a->ne[2] == b->ne[2])) &&
     (a->ne[3] == b->ne[3])) {
    if (inplace) {
      pgVar2 = ggml_new_tensor_impl(ctx,a->type,a->n_dims,a->ne,a->data);
      pgVar2->op = GGML_OP_SUB;
      pgVar3 = (ggml_tensor *)0x0;
    }
    else {
      if ((a->grad == (ggml_tensor *)0x0) && (b->grad == (ggml_tensor *)0x0)) {
        bVar1 = false;
      }
      else {
        bVar1 = true;
      }
      pgVar3 = (ggml_tensor *)0x0;
      pgVar2 = ggml_new_tensor_impl(ctx,a->type,a->n_dims,a->ne,(void *)0x0);
      pgVar2->op = GGML_OP_SUB;
      if (bVar1) {
        pgVar3 = ggml_new_tensor_impl(ctx,pgVar2->type,pgVar2->n_dims,pgVar2->ne,(void *)0x0);
      }
    }
    pgVar2->grad = pgVar3;
    pgVar2->src0 = a;
    pgVar2->src1 = b;
    return pgVar2;
  }
  ggml_sub_impl_cold_1();
  pgVar2 = ggml_sub_impl(ctx,a,b_00,false);
  return pgVar2;
}

Assistant:

struct ggml_tensor * ggml_sub_impl(
        struct ggml_context * ctx,
        struct ggml_tensor * a,
        struct ggml_tensor * b,
        bool inplace) {
    GGML_ASSERT(ggml_are_same_shape(a, b));

    bool is_node = false;

    if (!inplace && (a->grad || b->grad)) {
        is_node = true;
    }

    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);

    result->op   = GGML_OP_SUB;
    result->grad = is_node ? ggml_dup_tensor(ctx, result) : NULL;
    result->src0 = a;
    result->src1 = b;

    return result;
}